

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_zvpbeint.c
# Opt level: O2

void gga_c_zvpbeint_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  puVar2 = (undefined4 *)malloc(0x18);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0x22d) {
    uVar3 = 0x76c8b439;
    uVar4 = 0x3faa9fbe;
    uVar5 = 0;
    uVar6 = 0x3ff00000;
  }
  else {
    if (iVar1 != 0x22e) {
      fwrite("Internal error in gga_c_zvpbeint\n",0x21,1,_stderr);
      exit(1);
    }
    uVar3 = 0xdf3b645a;
    uVar4 = 0x3fa78d4f;
    uVar5 = 0xcccccccd;
    uVar6 = 0x3ffccccc;
  }
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = uVar5;
  puVar2[3] = uVar6;
  *(undefined8 *)(puVar2 + 4) = 0x4012000000000000;
  return;
}

Assistant:

static void
gga_c_zvpbeint_init(xc_func_type *p)
{
  gga_c_zvpbeint_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_c_zvpbeint_params));
  params = (gga_c_zvpbeint_params *) (p->params);

  switch(p->info->number){
  case XC_GGA_C_ZVPBEINT:
    params->beta  = 0.052;
    params->alpha = 1.0;
    params->omega = 4.5;
    break;
  case XC_GGA_C_ZVPBESOL:
    params->beta  = 0.046;
    params->alpha = 1.8;
    params->omega = 4.5;
    break;
  default:
    fprintf(stderr, "Internal error in gga_c_zvpbeint\n");
    exit(1);
  }
}